

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall Sudoku::restart(Sudoku *this)

{
  uint *puVar1;
  sudoku_policko sVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Sudoku temp;
  sudoku_policko local_1d4 [81];
  uint local_90 [9];
  uint auStack_6c [9];
  uint auStack_48 [10];
  int local_20;
  
  uVar6 = 0;
  memset(local_1d4,0,0x1bc);
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar6;
    if (((uint)(this->s).pole[uVar6] & 0x10) != 0) {
      uVar5 = (uint)uVar6;
      sVar2 = (this->s).pole[uVar6];
      local_1d4[uVar6] = sVar2;
      uVar4 = 1 << (sVar2._0_1_ & 0xf);
      auStack_6c[(uVar5 & 0xff) / 9] = auStack_6c[(uVar5 & 0xff) / 9] | uVar4;
      puVar1 = (uint *)((long)local_90 +
                       uVar6 * 4 +
                       (SUB168(auVar3 * ZEXT816(0xe38e38e38e38e38f),8) >> 1 & 0xfffffffffffffffc) *
                       -9);
      *puVar1 = *puVar1 | uVar4;
      puVar1 = (uint *)((long)auStack_48 +
                       (ulong)((uVar5 & 0xff) * 0x13 >> 7 & 0x3c) +
                       (ulong)(((((uVar5 & 0xff) / 9) * -9 & 0xff) + uVar5 & 0xff) / 3) * 0xc);
      *puVar1 = *puVar1 | uVar4;
      local_20 = local_20 + 1;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x51);
  memcpy(this,local_1d4,0x1bc);
  return;
}

Assistant:

void Sudoku::restart( void )
{
  Sudoku temp(-1); // operace probiha kopirovanim do docasneho sudoku
  int x,y;
  for(int i = 0; i< 81; i++)// projdeme vse
  {
    if(s.pole[i].pevne)// narazime-li na pevne cislo
    {
      // prekopirujeme jeho stav
      temp.s.pole[i] = s.pole[i];
      x = i % 9;
      y = i / 9;
      // a nastavime zakazane hodnoty pro radky/sloupce/ctverce
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
      temp.s.doplnenych ++; // mame dalsi doplnene cislo
    }
  }
  // preneseni stavu z docasneho sudoku do puvodniho (tohoto)
  s = temp.s;
}